

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectSubroutineBinding
          (FunctionalTest3_4 *this,GLuint program_id,GLchar **subroutine_names,
          GLchar **uniform_names,bool use_program_query)

{
  char *pcVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  size_t sVar6;
  byte bVar7;
  long lVar8;
  GLuint program_id_00;
  long lVar9;
  GLint n_active_subroutine_uniforms;
  GLuint queried_subroutine_index;
  GLint n_active_subroutines;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subroutine_uniforms;
  int local_20c;
  GLuint local_208;
  GLuint local_204;
  undefined4 local_200;
  uint local_1fc;
  uint local_1f8;
  int local_1f4;
  FunctionalTest3_4 *local_1f0;
  GLchar **local_1e8;
  GLchar **local_1e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d8;
  ulong local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar5;
  
  local_1f0 = this;
  local_1e8 = uniform_names;
  local_1e0 = subroutine_names;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  local_1f4 = 0;
  local_20c = 0;
  local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_204 = 0;
  local_208 = program_id;
  (**(code **)(lVar5 + 0x9d0))(program_id,0x8b31,0x8de5);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"GetProgramStageiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe2f);
  (**(code **)(lVar5 + 0x9d0))(local_208,0x8b31,0x8de6,&local_20c);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"GetProgramStageiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe32);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_1d8,(long)local_20c);
  if (local_20c < 1) {
    bVar7 = 1;
  }
  else {
    local_200 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    lVar8 = 0;
    local_1fc = (uint)use_program_query;
    program_id_00 = local_208;
    do {
      local_1f8 = getSubroutineUniformLocation
                            (local_1f0,program_id_00,local_1e8[lVar8],SUB41(local_1fc,0));
      if (0 < local_1f4) {
        local_1b8 = (ulong)local_1f8;
        lVar9 = 0;
        do {
          GVar4 = getSubroutineIndex(local_1f0,program_id_00,local_1e0[lVar9],SUB41(local_1fc,0));
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar8] = GVar4;
          (**(code **)(lVar5 + 0x1668))(0x8b31,local_20c);
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"UniformSubroutinesuiv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0xe41);
          (**(code **)(lVar5 + 0xb50))(0x8b31,local_1f8,&local_204);
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"GetUniformSubroutineuiv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0xe44);
          if (local_204 != GVar4) {
            local_1b0 = (undefined1  [8])((local_1f0->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,
                       "Error. Invalid result. Function: gl.getUniformSubroutineuiv.",0x3c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8," Subroutine uniform: ",0x15);
            std::ostream::operator<<((ostringstream *)&local_1a8,(int)lVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", name: ",8);
            pcVar1 = local_1e8[lVar8];
            iVar2 = (int)(ostringstream *)&local_1a8;
            if (pcVar1 == (char *)0x0) {
              std::ios::clear((int)local_1a8[-3] + iVar2);
            }
            else {
              sVar6 = strlen(pcVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar6)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,", location: ",0xc);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,". Subroutine: ",0xe);
            std::ostream::operator<<((ostringstream *)&local_1a8,(int)lVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", name: ",8);
            pcVar1 = local_1e0[lVar9];
            if (pcVar1 == (char *)0x0) {
              std::ios::clear((int)local_1a8[-3] + iVar2);
            }
            else {
              sVar6 = strlen(pcVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar6)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", index: ",9);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,". Result: ",10);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
            local_200 = 0;
            program_id_00 = local_208;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < local_1f4);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_20c);
    bVar7 = (byte)local_200;
  }
  if (local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool FunctionalTest3_4::inspectSubroutineBinding(GLuint program_id, const GLchar** subroutine_names,
												 const GLchar** uniform_names, bool use_program_query) const
{
	const glw::Functions& gl						   = m_context.getRenderContext().getFunctions();
	bool				  result					   = true;
	GLint				  n_active_subroutines		   = 0;
	GLint				  n_active_subroutine_uniforms = 0;
	std::vector<GLuint>   subroutine_uniforms;
	GLuint				  queried_subroutine_index = 0;

	gl.getProgramStageiv(program_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINES, &n_active_subroutines);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramStageiv");

	gl.getProgramStageiv(program_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINE_UNIFORMS, &n_active_subroutine_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramStageiv");

	subroutine_uniforms.resize(n_active_subroutine_uniforms);

	for (GLint uniform = 0; uniform < n_active_subroutine_uniforms; ++uniform)
	{
		GLuint uniform_location = getSubroutineUniformLocation(program_id, uniform_names[uniform], use_program_query);

		for (GLint routine = 0; routine < n_active_subroutines; ++routine)
		{
			GLuint routine_index = getSubroutineIndex(program_id, subroutine_names[routine], use_program_query);

			subroutine_uniforms[uniform] = routine_index;

			gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, n_active_subroutine_uniforms, &subroutine_uniforms[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

			gl.getUniformSubroutineuiv(GL_VERTEX_SHADER, uniform_location, &queried_subroutine_index);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformSubroutineuiv");

			if (queried_subroutine_index != routine_index)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Error. Invalid result. Function: gl.getUniformSubroutineuiv."
					<< " Subroutine uniform: " << uniform << ", name: " << uniform_names[uniform]
					<< ", location: " << uniform_location << ". Subroutine: " << routine
					<< ", name: " << subroutine_names[routine] << ", index: " << routine_index
					<< ". Result: " << queried_subroutine_index << tcu::TestLog::EndMessage;

				result = false;
			}
		}
	}

	return result;
}